

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

_Bool tbl_MoveDeskToDesk(int sourceIdx,int targetIdx)

{
  SolStack_t *stackPtr;
  undefined4 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  ulong uVar4;
  ECardFace_t *pEVar5;
  bool bVar6;
  Card_t card;
  Card_t helpCard;
  SolStack_t helpStack;
  Card_t local_2b8;
  SolStack_t local_2a8;
  
  bVar6 = DeskStacks[sourceIdx].m_size != 0;
  if (bVar6) {
    stackPtr = DeskStacks + sourceIdx;
    pEVar5 = &DeskStacks[sourceIdx].m_cards[0].m_face;
    uVar4 = 0;
    do {
      if ((*pEVar5 == CF_UP) &&
         (uVar1 = ((Card_t *)(pEVar5 + -2))->m_type, uVar2 = ((Card_t *)(pEVar5 + -2))->m_color,
         card.m_color = uVar2, card.m_type = uVar1, card.m_face = CF_UP,
         _Var3 = IsCardMovableToDesk(card,DeskStacks + targetIdx), _Var3)) {
        stk_InitEmpty(&local_2a8);
        if (uVar4 < stackPtr->m_size) {
          do {
            _Var3 = stk_Pop(stackPtr,&local_2b8);
            if (_Var3) {
              stk_PushCopy(&local_2a8,local_2b8);
            }
          } while (uVar4 < stackPtr->m_size);
        }
        _Var3 = stk_Pop(&local_2a8,&local_2b8);
        if (_Var3) {
          do {
            stk_PushCopy(DeskStacks + targetIdx,local_2b8);
            _Var3 = stk_Pop(&local_2a8,&local_2b8);
          } while (_Var3);
        }
        stk_TurnTopCardUp(stackPtr);
        return bVar6;
      }
      uVar4 = uVar4 + 1;
      pEVar5 = pEVar5 + 3;
      bVar6 = uVar4 < stackPtr->m_size;
    } while (uVar4 < stackPtr->m_size);
  }
  return bVar6;
}

Assistant:

bool tbl_MoveDeskToDesk(int sourceIdx, int targetIdx)
{
  SolStack_t* srcStackPtr = &DeskStacks[sourceIdx];
  SolStack_t* targetPtr = &DeskStacks[targetIdx];
  SolStack_t helpStack;
  Card_t helpCard;
  Card_t* srcCardPtr = NULL;
  int srcCardIdx;

  // try to find card facing up in the source column that would fit on target
  // card or empty slot
  for (srcCardIdx = 0; srcCardIdx < srcStackPtr->m_size; srcCardIdx++) {
    srcCardPtr = &srcStackPtr->m_cards[srcCardIdx];
    if (srcCardPtr->m_face == CF_UP &&
        IsCardMovableToDesk(*srcCardPtr, targetPtr)) {
      break; // got it
    }
    srcCardPtr = NULL;
  }

  if (!srcCardPtr) {
    return false;
  }

  // move cards from one stack to the other
  stk_InitEmpty(&helpStack);

  while (srcCardIdx < srcStackPtr->m_size) {
    if (stk_Pop(srcStackPtr, &helpCard)) {
      stk_PushCopy(&helpStack, helpCard);
    }
  }

  while (stk_Pop(&helpStack, &helpCard)) {
    stk_PushCopy(targetPtr, helpCard);
  }

  stk_TurnTopCardUp(srcStackPtr);

  return true;
}